

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O2

EVsource INT_EVcreate_submit_handle_free
                   (CManager_conflict cm,EVstone stone,FMStructDescList data_format,
                   EVFreeFunction free_func,void *free_data)

{
  EVsource p_Var1;
  CMFormat p_Var2;
  FMFormat p_Var3;
  
  p_Var1 = (EVsource)INT_CMmalloc(0x30);
  p_Var1->free_data = (void *)0x0;
  p_Var1->local_stone_id = 0;
  p_Var1->preencoded = 0;
  p_Var1->free_func = (EVFreeFunction)0x0;
  p_Var1->format = (CMFormat)0x0;
  p_Var1->reference_format = (FMFormat)0x0;
  p_Var1->local_stone_id = stone;
  p_Var1->cm = cm;
  p_Var2 = INT_CMregister_format(cm,data_format);
  p_Var1->format = p_Var2;
  p_Var3 = EVregister_format_set(cm,data_format);
  p_Var1->reference_format = p_Var3;
  p_Var1->free_func = free_func;
  p_Var1->free_data = free_data;
  p_Var1->preencoded = 0;
  return p_Var1;
}

Assistant:

extern EVsource
INT_EVcreate_submit_handle_free(CManager cm, EVstone stone, 
			    FMStructDescList data_format, 
			    EVFreeFunction free_func, void *free_data)
{
    EVsource source = malloc(sizeof(*source));
    memset(source, 0, sizeof(*source));
    source->local_stone_id = stone;
    source->cm = cm;
    source->format = INT_CMregister_format(cm, data_format);
    source->reference_format = EVregister_format_set(cm, data_format);
    source->free_func = free_func;
    source->free_data = free_data;
    source->preencoded = 0;
    return source;
}